

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O3

void __thiscall google::protobuf::compiler::python::Generator::PrintServices(Generator *this)

{
  FileDescriptor *pFVar1;
  long lVar2;
  long lVar3;
  string_view text;
  
  pFVar1 = this->file_;
  if (0 < pFVar1->service_count_) {
    lVar2 = 0;
    lVar3 = 0;
    do {
      PrintServiceClass(this,(ServiceDescriptor *)(&pFVar1->services_->super_SymbolBase + lVar2));
      if (this->file_->service_count_ <= lVar3) {
        PrintServices();
      }
      PrintServiceStub(this,(ServiceDescriptor *)(&this->file_->services_->super_SymbolBase + lVar2)
                      );
      text._M_str = "\n";
      text._M_len = 1;
      io::Printer::Print<>(this->printer_,text);
      lVar3 = lVar3 + 1;
      pFVar1 = this->file_;
      lVar2 = lVar2 + 0x40;
    } while (lVar3 < pFVar1->service_count_);
  }
  return;
}

Assistant:

void Generator::PrintServices() const {
  for (int i = 0; i < file_->service_count(); ++i) {
    PrintServiceClass(*file_->service(i));
    PrintServiceStub(*file_->service(i));
    printer_->Print("\n");
  }
}